

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O0

ON_wString __thiscall
ON_wString::HexadecimalFromBytes
          (ON_wString *this,ON__UINT8 *bytes,size_t byte_count,bool bCapitalDigits,bool bReverse)

{
  bool bVar1;
  wchar_t *str_00;
  wchar_t *wstr0;
  char *local_58;
  char *str;
  wchar_t *wstr;
  ON_wString local_38;
  ON_wString s;
  size_t s_length;
  bool bReverse_local;
  bool bCapitalDigits_local;
  size_t byte_count_local;
  ON__UINT8 *bytes_local;
  
  if ((bytes == (ON__UINT8 *)0x0) || (byte_count == 0)) {
    ON_wString(this,&ON_String::EmptyString);
  }
  else {
    s.m_s = (wchar_t *)(byte_count * 2);
    ON_wString(&local_38);
    ReserveArray(&local_38,(size_t)s.m_s);
    SetLength(&local_38,(size_t)s.m_s);
    str_00 = Array(&local_38);
    bVar1 = ON_BytesToHexadecimalString
                      (bytes,byte_count,bCapitalDigits,bReverse,(char *)str_00,(size_t)s.m_s);
    if (bVar1) {
      str = (char *)(str_00 + (long)s.m_s);
      local_58 = (char *)((long)s.m_s + (long)str_00);
      while (str_00 < str) {
        str = str + -4;
        local_58 = local_58 + -1;
        *(int *)str = (int)*local_58;
      }
      ON_wString(this,&local_38);
    }
    else {
      ON_wString(this,&ON_String::EmptyString);
    }
    ~ON_wString(&local_38);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::HexadecimalFromBytes(
  const ON__UINT8* bytes,
  size_t byte_count,
  bool bCapitalDigits,
  bool bReverse
  )
{
  if (nullptr == bytes || byte_count <= 0)
    return ON_String::EmptyString;

  size_t s_length = 2 * byte_count;
  ON_wString s;
  s.ReserveArray(s_length);
  s.SetLength(s_length);
  wchar_t* wstr = s.Array();
  char* str = (char*)wstr;
  if ( false == ON_BytesToHexadecimalString(bytes,byte_count,bCapitalDigits,bReverse,str,s_length) )
    return ON_String::EmptyString;
  wchar_t* wstr0 = wstr;
  wstr += s_length;
  str += s_length;
  while (wstr > wstr0)
  {
    wstr--;
    str--;
    *wstr = (wchar_t)*str; // all str[] elements are single byte UTF-8 encodings
  }

  return s;
}